

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyJointMotor.cpp
# Opt level: O3

void __thiscall
btMultiBodyJointMotor::createConstraintRows
          (btMultiBodyJointMotor *this,btMultiBodyConstraintArray *constraintRows,
          btMultiBodyJacobianData *data,btContactSolverInfo *infoGlobal)

{
  btMultiBodySolverConstraint *solverConstraint;
  btScalar upperLimit;
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  eFeatherstoneJointType eVar4;
  float *pfVar5;
  btMultibodyLink *pbVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  void *pvVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  btQuaternion q;
  btVector3 local_48;
  
  if (((this->super_btMultiBodyConstraint).m_numDofsFinalized ==
       (this->super_btMultiBodyConstraint).m_jacSizeBoth) ||
     ((*(this->super_btMultiBodyConstraint)._vptr_btMultiBodyConstraint[2])(this),
     (this->super_btMultiBodyConstraint).m_numDofsFinalized ==
     (this->super_btMultiBodyConstraint).m_jacSizeBoth)) {
    local_48.m_floats[0] = 0.0;
    local_48.m_floats[1] = 0.0;
    local_48.m_floats[2] = 0.0;
    local_48.m_floats[3] = 0.0;
    iVar11 = (this->super_btMultiBodyConstraint).m_numRows;
    if (0 < iVar11) {
      iVar17 = 0;
      do {
        uVar3 = *(uint *)(constraintRows + 4);
        uVar13 = uVar3;
        if (uVar3 == *(uint *)(constraintRows + 8)) {
          iVar15 = uVar3 * 2;
          if (uVar3 == 0) {
            iVar15 = 1;
          }
          if ((int)uVar3 < iVar15) {
            if (iVar15 == 0) {
              pvVar12 = (void *)0x0;
            }
            else {
              pvVar12 = btAlignedAllocInternal((long)iVar15 * 0xe0,0x10);
              uVar13 = *(uint *)(constraintRows + 4);
            }
            if (0 < (int)uVar13) {
              lVar18 = 0;
              do {
                memcpy((void *)(lVar18 + (long)pvVar12),
                       (void *)(*(long *)(constraintRows + 0x10) + lVar18),0xe0);
                lVar18 = lVar18 + 0xe0;
              } while ((ulong)uVar13 * 0xe0 - lVar18 != 0);
            }
            if ((*(void **)(constraintRows + 0x10) != (void *)0x0) &&
               (constraintRows[0x18] == (btMultiBodyConstraintArray)0x1)) {
              btAlignedFreeInternal(*(void **)(constraintRows + 0x10));
            }
            constraintRows[0x18] = (btMultiBodyConstraintArray)0x1;
            *(void **)(constraintRows + 0x10) = pvVar12;
            *(int *)(constraintRows + 8) = iVar15;
            iVar11 = (this->super_btMultiBodyConstraint).m_numRows;
            uVar13 = *(uint *)(constraintRows + 4);
          }
        }
        *(uint *)(constraintRows + 4) = uVar13 + 1;
        lVar18 = *(long *)(constraintRows + 0x10);
        lVar16 = (long)(int)uVar3 * 0xe0;
        solverConstraint = (btMultiBodySolverConstraint *)(lVar18 + lVar16);
        pfVar5 = (this->super_btMultiBodyConstraint).m_data.m_data;
        lVar14 = (long)((this->super_btMultiBodyConstraint).m_jacSizeBoth * iVar17 + iVar11);
        upperLimit = (this->super_btMultiBodyConstraint).m_maxAppliedImpulse;
        btMultiBodyConstraint::fillMultiBodyConstraint
                  (&this->super_btMultiBodyConstraint,solverConstraint,data,pfVar5 + lVar14,
                   pfVar5 + (this->super_btMultiBodyConstraint).m_jacSizeA + lVar14,&local_48,
                   &local_48,&local_48,0.0,infoGlobal,-upperLimit,upperLimit,1.0,false,
                   this->m_desiredVelocity,0.0);
        *(btMultiBodyJointMotor **)(lVar18 + 0xd0 + lVar16) = this;
        *(int *)(lVar18 + 0xd8 + lVar16) = iVar17;
        iVar11 = (this->super_btMultiBodyConstraint).m_linkA;
        pbVar6 = (((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data;
        eVar4 = pbVar6[iVar11].m_jointType;
        if (eVar4 == ePrismatic) {
          btMatrix3x3::getRotation(&pbVar6[iVar11].m_cachedWorldTransform.m_basis,&q);
          fVar20 = q.super_btQuadWord.m_floats[2];
          fVar22 = q.super_btQuadWord.m_floats[3];
          iVar11 = (this->super_btMultiBodyConstraint).m_linkA;
          pbVar6 = (((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data;
          fVar19 = pbVar6[iVar11].m_axes[0].m_bottomVec.m_floats[2];
          uVar1 = *(undefined8 *)pbVar6[iVar11].m_axes[0].m_bottomVec.m_floats;
          uVar2 = *(undefined8 *)(pbVar6[iVar11].m_axes[0].m_bottomVec.m_floats + 1);
          fVar23 = (float)uVar1;
          fVar28 = (float)((ulong)uVar1 >> 0x20);
          fVar26 = q.super_btQuadWord.m_floats[0];
          fVar21 = (fVar22 * fVar28 + fVar20 * fVar23) - fVar26 * fVar19;
          fVar27 = q.super_btQuadWord.m_floats[1];
          fVar24 = (fVar19 * fVar22 + (float)uVar2 * fVar26) - fVar27 * fVar23;
          fVar25 = (fVar23 * fVar22 + (float)((ulong)uVar2 >> 0x20) * fVar27) - fVar20 * fVar28;
          fVar29 = -fVar27;
          fVar30 = -fVar20;
          fVar23 = fVar19 * fVar30 + (fVar28 * fVar29 - fVar23 * fVar26);
          fVar19 = fVar27 * fVar24 + fVar30 * fVar21 + -fVar26 * fVar23 + fVar25 * fVar22;
          fVar20 = fVar20 * fVar25 + -fVar26 * fVar24 + fVar29 * fVar23 + fVar21 * fVar22;
          fVar22 = fVar21 * fVar26 + fVar25 * fVar29 + fVar23 * fVar30 + fVar24 * fVar22;
          auVar10._4_4_ = fVar20;
          auVar10._0_4_ = fVar19;
          auVar10._8_4_ = fVar22;
          auVar10._12_4_ = 0;
          *(undefined1 (*) [16])(solverConstraint->m_contactNormal1).m_floats = auVar10;
          auVar8._8_4_ = -fVar22;
          auVar8._0_8_ = CONCAT44(fVar20,fVar19) ^ 0x8000000080000000;
          auVar8._12_4_ = 0;
          *(undefined1 (*) [16])(solverConstraint->m_contactNormal2).m_floats = auVar8;
          (solverConstraint->m_relpos1CrossNormal).m_floats[0] = 0.0;
          (solverConstraint->m_relpos1CrossNormal).m_floats[1] = 0.0;
          (solverConstraint->m_relpos1CrossNormal).m_floats[2] = 0.0;
          (solverConstraint->m_relpos1CrossNormal).m_floats[3] = 0.0;
          (solverConstraint->m_relpos2CrossNormal).m_floats[0] = 0.0;
          (solverConstraint->m_relpos2CrossNormal).m_floats[1] = 0.0;
          (solverConstraint->m_relpos2CrossNormal).m_floats[2] = 0.0;
          (solverConstraint->m_relpos2CrossNormal).m_floats[3] = 0.0;
        }
        else if (eVar4 == eRevolute) {
          (solverConstraint->m_contactNormal1).m_floats[0] = 0.0;
          (solverConstraint->m_contactNormal1).m_floats[1] = 0.0;
          (solverConstraint->m_contactNormal1).m_floats[2] = 0.0;
          (solverConstraint->m_contactNormal1).m_floats[3] = 0.0;
          (solverConstraint->m_contactNormal2).m_floats[0] = 0.0;
          (solverConstraint->m_contactNormal2).m_floats[1] = 0.0;
          (solverConstraint->m_contactNormal2).m_floats[2] = 0.0;
          (solverConstraint->m_contactNormal2).m_floats[3] = 0.0;
          btMatrix3x3::getRotation
                    (&(((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data
                      [(this->super_btMultiBodyConstraint).m_linkA].m_cachedWorldTransform.m_basis,
                     &q);
          fVar20 = q.super_btQuadWord.m_floats[2];
          fVar22 = q.super_btQuadWord.m_floats[3];
          iVar11 = (this->super_btMultiBodyConstraint).m_linkA;
          pbVar6 = (((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data;
          fVar19 = pbVar6[iVar11].m_axes[0].m_topVec.m_floats[2];
          uVar1 = *(undefined8 *)pbVar6[iVar11].m_axes[0].m_topVec.m_floats;
          uVar2 = *(undefined8 *)(pbVar6[iVar11].m_axes[0].m_topVec.m_floats + 1);
          fVar23 = (float)uVar1;
          fVar28 = (float)((ulong)uVar1 >> 0x20);
          fVar26 = q.super_btQuadWord.m_floats[0];
          fVar21 = (fVar22 * fVar28 + fVar20 * fVar23) - fVar26 * fVar19;
          fVar27 = q.super_btQuadWord.m_floats[1];
          fVar24 = (fVar19 * fVar22 + (float)uVar2 * fVar26) - fVar27 * fVar23;
          fVar25 = (fVar23 * fVar22 + (float)((ulong)uVar2 >> 0x20) * fVar27) - fVar20 * fVar28;
          fVar29 = -fVar27;
          fVar30 = -fVar20;
          fVar23 = fVar19 * fVar30 + (fVar28 * fVar29 - fVar23 * fVar26);
          fVar19 = fVar27 * fVar24 + fVar30 * fVar21 + -fVar26 * fVar23 + fVar25 * fVar22;
          fVar20 = fVar20 * fVar25 + -fVar26 * fVar24 + fVar29 * fVar23 + fVar21 * fVar22;
          fVar22 = fVar21 * fVar26 + fVar25 * fVar29 + fVar23 * fVar30 + fVar24 * fVar22;
          auVar9._4_4_ = fVar20;
          auVar9._0_4_ = fVar19;
          auVar9._8_4_ = fVar22;
          auVar9._12_4_ = 0;
          *(undefined1 (*) [16])(solverConstraint->m_relpos1CrossNormal).m_floats = auVar9;
          auVar7._8_4_ = -fVar22;
          auVar7._0_8_ = CONCAT44(fVar20,fVar19) ^ 0x8000000080000000;
          auVar7._12_4_ = 0;
          *(undefined1 (*) [16])(solverConstraint->m_relpos2CrossNormal).m_floats = auVar7;
        }
        iVar17 = iVar17 + 1;
        iVar11 = (this->super_btMultiBodyConstraint).m_numRows;
      } while (iVar17 < iVar11);
    }
  }
  return;
}

Assistant:

void btMultiBodyJointMotor::createConstraintRows(btMultiBodyConstraintArray& constraintRows,
		btMultiBodyJacobianData& data,
		const btContactSolverInfo& infoGlobal)
{
    // only positions need to be updated -- data.m_jacobians and force
    // directions were set in the ctor and never change.
	
	if (m_numDofsFinalized != m_jacSizeBoth)
	{
        finalizeMultiDof();
	}

	//don't crash
	if (m_numDofsFinalized != m_jacSizeBoth)
		return;

	const btScalar posError = 0;
	const btVector3 dummy(0, 0, 0);

	for (int row=0;row<getNumRows();row++)
	{
		btMultiBodySolverConstraint& constraintRow = constraintRows.expandNonInitializing();


		fillMultiBodyConstraint(constraintRow,data,jacobianA(row),jacobianB(row),dummy,dummy,dummy,posError,infoGlobal,-m_maxAppliedImpulse,m_maxAppliedImpulse,1,false,m_desiredVelocity);
		constraintRow.m_orgConstraint = this;
		constraintRow.m_orgDofIndex = row;
		{
			//expect either prismatic or revolute joint type for now
			btAssert((m_bodyA->getLink(m_linkA).m_jointType == btMultibodyLink::eRevolute)||(m_bodyA->getLink(m_linkA).m_jointType == btMultibodyLink::ePrismatic));
			switch (m_bodyA->getLink(m_linkA).m_jointType)
			{
				case btMultibodyLink::eRevolute:
				{
					constraintRow.m_contactNormal1.setZero();
					constraintRow.m_contactNormal2.setZero();
					btVector3 revoluteAxisInWorld = quatRotate(m_bodyA->getLink(m_linkA).m_cachedWorldTransform.getRotation(),m_bodyA->getLink(m_linkA).m_axes[0].m_topVec);
					constraintRow.m_relpos1CrossNormal=revoluteAxisInWorld;
					constraintRow.m_relpos2CrossNormal=-revoluteAxisInWorld;
					
					break;
				}
				case btMultibodyLink::ePrismatic:
				{
					btVector3 prismaticAxisInWorld = quatRotate(m_bodyA->getLink(m_linkA).m_cachedWorldTransform.getRotation(),m_bodyA->getLink(m_linkA).m_axes[0].m_bottomVec);
					constraintRow.m_contactNormal1=prismaticAxisInWorld;
					constraintRow.m_contactNormal2=-prismaticAxisInWorld;
					constraintRow.m_relpos1CrossNormal.setZero();
					constraintRow.m_relpos2CrossNormal.setZero();
					
					break;
				}
				default:
				{
					btAssert(0);
				}
			};
			
		}

	}

}